

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  word wVar4;
  int local_24;
  int Fanin;
  int i;
  Vec_Wrd_t *vTemp_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(vTemp);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_WrdSize(vTemp) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0x7d,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  iVar1 = Gia_ObjIsLut(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut(p, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0x7e,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  for (local_24 = 0; iVar1 = Gia_ObjLutSize(p,iObj), local_24 < iVar1; local_24 = local_24 + 1) {
    piVar3 = Gia_ObjLutFanins(p,iObj);
    Vec_WrdWriteEntry(vTemp,piVar3[local_24],s_Truth6[local_24]);
  }
  if (6 < local_24) {
    __assert_fail("i <= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0x81,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
  wVar4 = Vec_WrdEntry(vTemp,iObj);
  return wVar4;
}

Assistant:

word Gia_ObjComputeTruthTable6Lut( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_LutForEachFanin( p, iObj, Fanin, i )
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    assert( i <= 6 );
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}